

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O2

int __thiscall sjtu::OrderManager::init(OrderManager *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar2;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RDX;
  undefined8 local_98;
  string local_90 [32];
  string local_70 [32];
  string local_50;
  string local_30;
  long lVar4;
  
  if ((int)ctx == 0) {
    pFVar2 = (FileManager<std::pair<sjtu::orderType,_long>_> *)operator_new(0x228);
    std::__cxx11::string::string((string *)&local_30,"OrderFile.dat",(allocator *)&local_98);
    FileManager<std::pair<sjtu::orderType,_long>_>::FileManager(pFVar2,&local_30,0x40);
    this->OrderFile = pFVar2;
    std::__cxx11::string::~string((string *)&local_30);
    pBVar3 = (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *)operator_new(0x18);
    std::__cxx11::string::string((string *)&local_50,"PendingBpTree.dat",(allocator *)&local_98);
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::BplusTree(pBVar3,&local_50,0x100);
    this->PendingBpTree = pBVar3;
    std::__cxx11::string::~string((string *)&local_50);
    pFVar2 = this->OrderFile;
    if ((pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).is_newfile != true) {
      local_98 = 0;
      iVar1 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[2])();
      iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0xa0);
      this->pending_id = iVar1;
      return iVar1;
    }
  }
  else {
    pFVar2 = this->OrderFile;
    std::__cxx11::string::string(local_70,"OrderFile.dat",(allocator *)&local_98);
    (**(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base)
              (pFVar2,local_70,0x40,1);
    std::__cxx11::string::~string(local_70);
    pBVar3 = this->PendingBpTree;
    std::__cxx11::string::string(local_90,"PendingBpTree.dat",(allocator *)&local_98);
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::init(pBVar3,(EVP_PKEY_CTX *)local_90);
    std::__cxx11::string::~string(local_90);
    pFVar2 = this->OrderFile;
  }
  iVar1 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[1])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  *(undefined8 *)(lVar4 + 0xb0) = extraout_RDX;
  *(undefined4 *)(lVar4 + 0xa0) = 0;
  iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[3])(this->OrderFile,lVar4 + 0xb0);
  return iVar1;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                OrderFile = new FileManager<std::pair<orderType, locType>>("OrderFile.dat" , OrderFile_cache_size);
                PendingBpTree = new BplusTree<std::pair<StringHasher::hashType, int>, locType>("PendingBpTree.dat" , PendingBpTree_cache_size);
                if (OrderFile->is_newfile) {
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
                } else {
                    auto tmp = OrderFile->read(0);
                    pending_id = tmp->first.num;
                }
            } else {
                OrderFile->init("OrderFile.dat", OrderFile_cache_size , true);
                PendingBpTree->init("PendingBpTree.dat", PendingBpTree_cache_size , true);
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
            }
        }